

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListEntryArray.cpp
# Opt level: O1

void __thiscall
DestListEntryArray::fillDestListEntryArray
          (DestListEntryArray *this,ReadStream *rs,int readFrom,DestListHeader *header)

{
  uint uVar1;
  uint *puVar2;
  uchar *puVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  pointer puVar7;
  DestListEntryArray *this_00;
  uchar *puVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entryStringData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> firstPartOfEntry;
  DestListEntry tmpDestListEntry;
  DestListEntryArray *local_1f0;
  uchar *local_1e8;
  long local_1e0;
  uchar *local_1d8;
  uchar *local_1d0;
  long local_1c8;
  DestListEntryArray *local_1c0;
  uchar *local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  DestListEntry local_198;
  
  local_1c0 = this;
  uVar4 = DestListHeader::getTotalNumberOfCurrentEntries(header);
  do {
    if ((int)uVar4 < 1) {
      return;
    }
    memset(&local_198,0,0x168);
    ReadStream::read((ReadStream *)&local_1d8,(int)rs,(void *)(ulong)(uint)readFrom,0x82);
    puVar3 = local_1d8;
    if (local_1d0 == local_1d8) {
      readFrom = readFrom + 0x82;
      puVar8 = local_1d0;
    }
    else {
      local_1b8 = local_1d0;
      puVar8 = local_1d8 + 8;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_1d8,puVar8,&local_198.Checksum);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar8,puVar3 + 0x18,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.VolumeId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x18,puVar3 + 0x28,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.ObjectId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x28,puVar3 + 0x38,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.BirthVolumeId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x38,puVar3 + 0x48,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.BirthObjectId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x48,puVar3 + 0x58,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.NetBIOSName);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x58,puVar3 + 0x5c,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.EntryId);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x5c,puVar3 + 100,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.Reserved1);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 100,puVar3 + 0x6c,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.MSFileTime);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x6c,puVar3 + 0x70,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.EntryPinStatus);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x70,puVar3 + 0x74,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.Reserved2);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x74,puVar3 + 0x78,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.AccessedCount);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x78,puVar3 + 0x80,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.Reserved3);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (puVar3 + 0x80,puVar3 + 0x82,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.LengthOfUnicodeData);
      puVar7 = local_198.LengthOfUnicodeData.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      puVar2 = local_198.LengthOfUnicodeData.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_198.LengthOfUnicodeData.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start < puVar7 &&
          local_198.LengthOfUnicodeData.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_198.LengthOfUnicodeData.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          puVar6 = puVar2 + 1;
          uVar1 = *puVar2;
          *puVar2 = *puVar7;
          *puVar7 = uVar1;
          puVar7 = puVar7 + -1;
          puVar2 = puVar6;
        } while (puVar6 < puVar7);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_1b0,&local_198.LengthOfUnicodeData);
      iVar5 = Utils::lenTwoBytes(&local_1b0);
      if (local_1b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1b0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ReadStream::read((ReadStream *)&local_1f0,(int)rs,(void *)(ulong)(readFrom + 0x86U),
                       (ulong)(uint)(iVar5 * 2));
      this_00 = local_1f0;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((uchar *)local_1f0,local_1e8,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_198.EntryStringData);
      reverseAllFields(this_00,&local_198);
      std::
      vector<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
      ::push_back(&local_1c0->destListEntryArray,&local_198);
      if (local_1f0 != (DestListEntryArray *)0x0) {
        operator_delete(local_1f0,local_1e0 - (long)local_1f0);
      }
      readFrom = readFrom + 0x86U + iVar5 * 2;
      uVar4 = uVar4 - 1;
      puVar8 = local_1b8;
    }
    if (local_1d8 != (uchar *)0x0) {
      operator_delete(local_1d8,local_1c8 - (long)local_1d8);
    }
    DestListEntry::~DestListEntry(&local_198);
  } while (puVar8 != puVar3);
  return;
}

Assistant:

void DestListEntryArray::fillDestListEntryArray(ReadStream *rs, int readFrom, DestListHeader header) {
    int count = header.getTotalNumberOfCurrentEntries();
    int tmpReadFrom = readFrom;

    while(count > 0) {
        DestListEntry tmpDestListEntry;

        std::vector<unsigned char> firstPartOfEntry = rs->read(tmpReadFrom,130);
        tmpReadFrom = 130 + tmpReadFrom;
        auto it = firstPartOfEntry.begin();

       if(firstPartOfEntry.size() != 0) {
            std::copy(it, it + 8, std::back_inserter(tmpDestListEntry.Checksum));
            it += 8;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.VolumeId));
            it += 16;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.ObjectId));
            it += 16;
            std::copy(it , it + 16, std::back_inserter(tmpDestListEntry.BirthVolumeId));
            it += 16;
            std::copy(it, it + 16, std::back_inserter(tmpDestListEntry.BirthObjectId));
            it += 16;
            std::copy(it , it + 16, std::back_inserter(tmpDestListEntry.NetBIOSName));
            it += 16;
            std::copy(it, it + 4, std::back_inserter(tmpDestListEntry.EntryId));
            tmpReadFrom = 4 + tmpReadFrom;
            it += 4;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.Reserved1));
            it += 8;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.MSFileTime));
            it += 8;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.EntryPinStatus));
            it += 4;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.Reserved2));
            it += 4;
            std::copy(it , it + 4, std::back_inserter(tmpDestListEntry.AccessedCount));
            it += 4;
            std::copy(it , it + 8, std::back_inserter(tmpDestListEntry.Reserved3));
            it += 8;
            std::copy(it, it + 2, std::back_inserter(tmpDestListEntry.LengthOfUnicodeData));
            reverse(tmpDestListEntry.LengthOfUnicodeData.begin(), tmpDestListEntry.LengthOfUnicodeData.end());
            int len = Utils::lenTwoBytes(tmpDestListEntry.LengthOfUnicodeData);
            len *= 2; // Because it is unicode characters
            std::vector<unsigned char> entryStringData =  rs->read(tmpReadFrom, len);
            std::copy(entryStringData.begin(), entryStringData.end(), std::back_inserter(tmpDestListEntry.EntryStringData));
            tmpReadFrom = len + tmpReadFrom;
            DestListEntryArray::reverseAllFields(&tmpDestListEntry);
            destListEntryArray.push_back(tmpDestListEntry);
            --count;
        } else break;
    }
}